

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tools.h
# Opt level: O2

double math::matrix_determinant<double>(Matrix<double,_3,_3> *m)

{
  return (((m->m[2] * m->m[3] * m->m[7] + m->m[0] * m->m[4] * m->m[8] + m->m[1] * m->m[5] * m->m[6])
          - m->m[4] * m->m[2] * m->m[6]) - m->m[3] * m->m[1] * m->m[8]) -
         m->m[5] * m->m[0] * m->m[7];
}

Assistant:

inline T
matrix_determinant (Matrix<T,3,3> const& m)
{
    return m[0] * m[4] * m[8] + m[1] * m[5] * m[6] + m[2] * m[3] * m[7]
         - m[2] * m[4] * m[6] - m[1] * m[3] * m[8] - m[0] * m[5] * m[7];
}